

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O3

void __thiscall xatlas::internal::param::Quality::computeMetrics(Quality *this,Mesh *mesh)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint8_t *puVar6;
  char *pcVar7;
  float *pfVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  Vector3 pos [3];
  Vector2 texcoord [3];
  float local_a8;
  float fStack_a4;
  float local_a0;
  float local_9c;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  float local_88;
  float local_78 [8];
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  
  this->totalParametricArea = 0.0;
  this->totalGeometricArea = 0.0;
  this->stretchMetric = 0.0;
  this->maxStretchMetric = 0.0;
  this->conformalMetric = 0.0;
  this->authalicMetric = 0.0;
  uVar3 = (mesh->m_indices).m_base.size;
  bVar15 = true;
  bVar14 = true;
  bVar13 = true;
  fVar16 = 0.0;
  fVar21 = 0.0;
  if (2 < uVar3) {
    lVar11 = 0;
    fVar17 = 0.0;
    fVar22 = 0.0;
    fVar25 = 0.0;
    uVar12 = 0;
    do {
      uVar4 = (mesh->m_indices).m_base.size;
      pfVar8 = &local_a8;
      lVar9 = 0;
      do {
        if (uVar4 <= (uint)(lVar11 + lVar9)) {
          pcVar7 = 
          "const T &xatlas::internal::Array<unsigned int>::operator[](uint32_t) const [T = unsigned int]"
          ;
LAB_00126ace:
          __assert_fail("index < m_base.size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                        ,0x478,pcVar7);
        }
        puVar6 = (mesh->m_indices).m_base.buffer;
        if (puVar6 == (uint8_t *)0x0) {
          pcVar7 = 
          "const T &xatlas::internal::Array<unsigned int>::operator[](uint32_t) const [T = unsigned int]"
          ;
LAB_00126a81:
          __assert_fail("m_base.buffer",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                        ,0x479,pcVar7);
        }
        uVar5 = *(uint *)(puVar6 + (lVar11 + lVar9 & 0xffffffffU) * 4);
        uVar10 = (ulong)uVar5;
        if ((mesh->m_positions).m_base.size <= uVar5) {
          pcVar7 = 
          "const T &xatlas::internal::Array<xatlas::internal::Vector3>::operator[](uint32_t) const [T = xatlas::internal::Vector3]"
          ;
          goto LAB_00126ace;
        }
        puVar6 = (mesh->m_positions).m_base.buffer;
        if (puVar6 == (uint8_t *)0x0) {
          pcVar7 = 
          "const T &xatlas::internal::Array<xatlas::internal::Vector3>::operator[](uint32_t) const [T = xatlas::internal::Vector3]"
          ;
          goto LAB_00126a81;
        }
        pfVar8[2] = *(float *)(puVar6 + uVar10 * 0xc + 8);
        *(undefined8 *)pfVar8 = *(undefined8 *)(puVar6 + uVar10 * 0xc);
        if ((mesh->m_texcoords).m_base.size <= uVar5) {
          pcVar7 = 
          "const T &xatlas::internal::Array<xatlas::internal::Vector2>::operator[](uint32_t) const [T = xatlas::internal::Vector2]"
          ;
          goto LAB_00126ace;
        }
        puVar6 = (mesh->m_texcoords).m_base.buffer;
        if (puVar6 == (uint8_t *)0x0) {
          pcVar7 = 
          "const T &xatlas::internal::Array<xatlas::internal::Vector2>::operator[](uint32_t) const [T = xatlas::internal::Vector2]"
          ;
          goto LAB_00126a81;
        }
        *(undefined8 *)(local_78 + lVar9 * 2) = *(undefined8 *)(puVar6 + uVar10 * 8);
        lVar9 = lVar9 + 1;
        pfVar8 = pfVar8 + 3;
      } while (lVar9 != 3);
      fVar19 = (float)local_78._4_8_;
      fVar18 = SUB84(local_78._4_8_,4);
      fVar27 = SUB84(local_78._16_8_,4);
      fVar28 = local_78[3] - fVar19;
      fVar24 = (float)local_78._16_8_ - local_78[0];
      fVar20 = (fVar28 * fVar24 - (fVar18 - local_78[0]) * (fVar27 - fVar19)) * 0.5;
      if (1.1920929e-07 < ABS(fVar20)) {
        fVar21 = (float)(~-(uint)(fVar20 < 0.0) & (uint)fVar20 |
                        (uint)ABS(fVar20) & -(uint)(fVar20 < 0.0));
        local_48 = ZEXT416((uint)local_98);
        fVar30 = (local_98 - fStack_a4) * (local_88 - local_a0) -
                 (local_8c - fStack_a4) * (local_94 - local_a0);
        fVar20 = (local_94 - local_a0) * (local_90 - local_a8) -
                 (local_88 - local_a0) * (local_9c - local_a8);
        fVar17 = (local_8c - fStack_a4) * (local_9c - local_a8) -
                 (local_90 - local_a8) * (local_98 - fStack_a4);
        fVar16 = fVar18 - (float)local_78._16_8_;
        fVar19 = fVar19 - fVar27;
        fVar31 = local_78[0] - fVar18;
        fVar29 = 1.0 / (fVar21 + fVar21);
        fVar27 = fVar27 - local_78[3];
        fVar25 = (local_90 * fVar31 + local_a8 * fVar16 + local_9c * fVar24) * fVar29;
        fVar26 = (local_90 * fVar28 + local_9c * fVar19 + local_a8 * fVar27) * fVar29;
        fVar22 = (local_8c * fVar31 + fStack_a4 * fVar16 + local_98 * fVar24) * fVar29;
        fVar23 = (local_8c * fVar28 + local_98 * fVar19 + fStack_a4 * fVar27) * fVar29;
        fVar24 = fVar29 * (local_88 * fVar31 + local_a0 * fVar16 + local_94 * fVar24);
        fVar29 = fVar29 * (local_88 * fVar28 + local_94 * fVar19 + local_a0 * fVar27);
        fVar16 = fVar29 * fVar24 + fVar26 * fVar25 + fVar23 * fVar22;
        fVar25 = fVar24 * fVar24 + fVar25 * fVar25 + fVar22 * fVar22;
        fVar19 = fVar29 * fVar29 + fVar26 * fVar26 + fVar23 * fVar23;
        fVar22 = fVar25 - fVar19;
        fVar22 = fVar16 * fVar16 * 4.0 + fVar22 * fVar22;
        fVar16 = SQRT(fVar17 * fVar17 + fVar30 * fVar30 + fVar20 * fVar20) * 0.5;
        local_58 = fVar18;
        fStack_54 = fVar18;
        fStack_50 = fVar18;
        fStack_4c = fVar18;
        if (fVar22 < 0.0) {
          fVar17 = sqrtf(fVar22);
        }
        else {
          fVar17 = SQRT(fVar22);
        }
        fVar25 = fVar25 + fVar19;
        fVar19 = 0.0;
        if (0.0 <= fVar25 - fVar17) {
          fVar19 = fVar25 - fVar17;
        }
        fVar19 = fVar19 * 0.5;
        if (fVar19 < 0.0) {
          fVar19 = sqrtf(fVar19);
        }
        else {
          fVar19 = SQRT(fVar19);
        }
        if (fVar22 < 0.0) {
          fVar22 = sqrtf(fVar22);
        }
        else {
          fVar22 = SQRT(fVar22);
        }
        fVar17 = 0.0;
        if (0.0 <= fVar22 + fVar25) {
          fVar17 = fVar22 + fVar25;
        }
        fVar17 = fVar17 * 0.5;
        if (fVar17 < 0.0) {
          fVar17 = sqrtf(fVar17);
        }
        else {
          fVar17 = SQRT(fVar17);
        }
        if (fVar17 <= fVar19) {
          fVar22 = ABS(fVar19);
          if (ABS(fVar19) <= ABS(fVar17)) {
            fVar22 = ABS(fVar17);
          }
          fVar18 = 1.0;
          if (1.0 <= fVar22) {
            fVar18 = fVar22;
          }
          if (s_print != (undefined *)0x0 && fVar18 * 0.0001 < ABS(fVar19 - fVar17)) {
            (*(code *)s_print)("\rASSERT: %s %s %d\n",
                               "sigma2 > sigma1 || equal(sigma1, sigma2, kEpsilon)",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                               ,0x1bb8);
          }
        }
        fVar25 = fVar25 * 0.5;
        if (fVar25 < 0.0) {
          fVar25 = sqrtf(fVar25);
        }
        else {
          fVar25 = SQRT(fVar25);
        }
        fVar22 = (fVar17 * fVar17 + fVar19 * fVar19) * 0.5;
        if (fVar22 < 0.0) {
          fVar22 = sqrtf(fVar22);
        }
        else {
          fVar22 = SQRT(fVar22);
        }
        fVar18 = ABS(fVar25);
        if (ABS(fVar25) <= ABS(fVar22)) {
          fVar18 = ABS(fVar22);
        }
        fVar20 = 1.0;
        if (1.0 <= fVar18) {
          fVar20 = fVar18;
        }
        if (fVar20 * 0.01 < ABS(fVar25 - fVar22)) {
          __assert_fail("equal(rmsStretch, rmsStretch2, 0.01f)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                        ,0x1bbe,
                        "void xatlas::internal::param::Quality::computeMetrics(const Mesh *)");
        }
        fVar25 = fVar25 * fVar25 * fVar16 + this->stretchMetric;
        this->stretchMetric = fVar25;
        fVar22 = this->maxStretchMetric;
        if (this->maxStretchMetric <= fVar17) {
          fVar22 = fVar17;
        }
        this->maxStretchMetric = fVar22;
        if (1e-06 < ABS(fVar19)) {
          this->conformalMetric = (fVar17 / fVar19) * fVar16 + this->conformalMetric;
        }
        fVar17 = fVar19 * fVar17 * fVar16 + this->authalicMetric;
        this->authalicMetric = fVar17;
        uVar1 = this->totalParametricArea;
        uVar2 = this->totalGeometricArea;
        fVar21 = fVar21 + (float)uVar1;
        fVar16 = fVar16 + (float)uVar2;
        this->totalParametricArea = fVar21;
        this->totalGeometricArea = fVar16;
      }
      uVar12 = uVar12 + 1;
      lVar11 = lVar11 + 3;
    } while (uVar12 != uVar3 / 3);
    bVar13 = (int)fVar25 + 0x807ffffeU < 0xfffffffe;
    bVar14 = (int)fVar22 + 0x807ffffeU < 0xfffffffe;
    bVar15 = (int)fVar17 + 0x807ffffeU < 0xfffffffe;
  }
  if ((fVar21 < 0.0) || (((uint)fVar21 & 0xfffffffe) == 0x7f800000)) {
    __assert_fail("isFinite(totalParametricArea) && totalParametricArea >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                  ,0x1bcb,"void xatlas::internal::param::Quality::computeMetrics(const Mesh *)");
  }
  if ((fVar16 < 0.0) || (((uint)fVar16 & 0xfffffffe) == 0x7f800000)) {
    __assert_fail("isFinite(totalGeometricArea) && totalGeometricArea >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                  ,0x1bcc,"void xatlas::internal::param::Quality::computeMetrics(const Mesh *)");
  }
  if (!bVar13) {
    __assert_fail("isFinite(stretchMetric)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                  ,0x1bcd,"void xatlas::internal::param::Quality::computeMetrics(const Mesh *)");
  }
  if (!bVar14) {
    __assert_fail("isFinite(maxStretchMetric)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                  ,0x1bce,"void xatlas::internal::param::Quality::computeMetrics(const Mesh *)");
  }
  if (0xfffffffd < (int)this->conformalMetric + 0x807ffffeU) {
    __assert_fail("isFinite(conformalMetric)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                  ,0x1bcf,"void xatlas::internal::param::Quality::computeMetrics(const Mesh *)");
  }
  if (bVar15) {
    if (0.0 < fVar16) {
      fVar21 = fVar21 / fVar16;
      if (fVar21 < 0.0) {
        fVar21 = sqrtf(fVar21);
      }
      else {
        fVar21 = SQRT(fVar21);
      }
      fVar16 = this->stretchMetric / this->totalGeometricArea;
      if (fVar16 < 0.0) {
        fVar16 = sqrtf(fVar16);
      }
      else {
        fVar16 = SQRT(fVar16);
      }
      this->stretchMetric = fVar16 * fVar21;
      this->maxStretchMetric = this->maxStretchMetric * fVar21;
      fVar21 = this->conformalMetric / this->totalGeometricArea;
      if (fVar21 < 0.0) {
        fVar21 = sqrtf(fVar21);
      }
      else {
        fVar21 = SQRT(fVar21);
      }
      this->conformalMetric = fVar21;
      fVar21 = this->authalicMetric / this->totalGeometricArea;
      if (fVar21 < 0.0) {
        fVar21 = sqrtf(fVar21);
      }
      else {
        fVar21 = SQRT(fVar21);
      }
      this->authalicMetric = fVar21;
    }
    return;
  }
  __assert_fail("isFinite(authalicMetric)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                ,0x1bd0,"void xatlas::internal::param::Quality::computeMetrics(const Mesh *)");
}

Assistant:

void computeMetrics(const Mesh *mesh)
	{
		totalGeometricArea = totalParametricArea = 0.0f;
		stretchMetric = maxStretchMetric = conformalMetric = authalicMetric = 0.0f;
		const uint32_t faceCount = mesh->faceCount();
		for (uint32_t f = 0; f < faceCount; f++) {
			Vector3 pos[3];
			Vector2 texcoord[3];
			for (int i = 0; i < 3; i++) {
				const uint32_t v = mesh->vertexAt(f * 3 + i);
				pos[i] = mesh->position(v);
				texcoord[i] = mesh->texcoord(v);
			}
			// Evaluate texture stretch metric. See:
			// - "Texture Mapping Progressive Meshes", Sander, Snyder, Gortler & Hoppe
			// - "Mesh Parameterization: Theory and Practice", Siggraph'07 Course Notes, Hormann, Levy & Sheffer.
			const float t1 = texcoord[0].x;
			const float s1 = texcoord[0].y;
			const float t2 = texcoord[1].x;
			const float s2 = texcoord[1].y;
			const float t3 = texcoord[2].x;
			const float s3 = texcoord[2].y;
			float parametricArea = ((s2 - s1) * (t3 - t1) - (s3 - s1) * (t2 - t1)) * 0.5f;
			if (isZero(parametricArea, kAreaEpsilon))
				continue;
			if (parametricArea < 0.0f)
				parametricArea = fabsf(parametricArea);
			const float geometricArea = length(cross(pos[1] - pos[0], pos[2] - pos[0])) / 2;
			const Vector3 Ss = (pos[0] * (t2 - t3) + pos[1] * (t3 - t1) + pos[2] * (t1 - t2)) / (2 * parametricArea);
			const Vector3 St = (pos[0] * (s3 - s2) + pos[1] * (s1 - s3) + pos[2] * (s2 - s1)) / (2 * parametricArea);
			const float a = dot(Ss, Ss); // E
			const float b = dot(Ss, St); // F
			const float c = dot(St, St); // G
										 // Compute eigen-values of the first fundamental form:
			const float sigma1 = sqrtf(0.5f * max(0.0f, a + c - sqrtf(square(a - c) + 4 * square(b)))); // gamma uppercase, min eigenvalue.
			const float sigma2 = sqrtf(0.5f * max(0.0f, a + c + sqrtf(square(a - c) + 4 * square(b)))); // gamma lowercase, max eigenvalue.
			XA_ASSERT(sigma2 > sigma1 || equal(sigma1, sigma2, kEpsilon));
			// isometric: sigma1 = sigma2 = 1
			// conformal: sigma1 / sigma2 = 1
			// authalic: sigma1 * sigma2 = 1
			const float rmsStretch = sqrtf((a + c) * 0.5f);
			const float rmsStretch2 = sqrtf((square(sigma1) + square(sigma2)) * 0.5f);
			XA_DEBUG_ASSERT(equal(rmsStretch, rmsStretch2, 0.01f));
			XA_UNUSED(rmsStretch2);
			stretchMetric += square(rmsStretch) * geometricArea;
			maxStretchMetric = max(maxStretchMetric, sigma2);
			if (!isZero(sigma1, 0.000001f)) {
				// sigma1 is zero when geometricArea is zero.
				conformalMetric += (sigma2 / sigma1) * geometricArea;
			}
			authalicMetric += (sigma1 * sigma2) * geometricArea;
			// Accumulate total areas.
			totalGeometricArea += geometricArea;
			totalParametricArea += parametricArea;
		}
		XA_DEBUG_ASSERT(isFinite(totalParametricArea) && totalParametricArea >= 0);
		XA_DEBUG_ASSERT(isFinite(totalGeometricArea) && totalGeometricArea >= 0);
		XA_DEBUG_ASSERT(isFinite(stretchMetric));
		XA_DEBUG_ASSERT(isFinite(maxStretchMetric));
		XA_DEBUG_ASSERT(isFinite(conformalMetric));
		XA_DEBUG_ASSERT(isFinite(authalicMetric));
		if (totalGeometricArea > 0.0f) {
			const float normFactor = sqrtf(totalParametricArea / totalGeometricArea);
			stretchMetric = sqrtf(stretchMetric / totalGeometricArea) * normFactor;
			maxStretchMetric  *= normFactor;
			conformalMetric = sqrtf(conformalMetric / totalGeometricArea);
			authalicMetric = sqrtf(authalicMetric / totalGeometricArea);
		}
	}